

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O3

bool __thiscall ON_wString::IsValidMatrix(ON_wString *this)

{
  wchar_t *wsz;
  bool bVar1;
  ON_Internal_Empty_wString *pOVar2;
  
  wsz = this->m_s;
  pOVar2 = &empty_wstring;
  if (wsz != (wchar_t *)0x0) {
    pOVar2 = (ON_Internal_Empty_wString *)(wsz + -3);
  }
  bVar1 = IsCommaDelimitedDoubleArray(wsz,(pOVar2->header).string_length,0x10);
  return bVar1;
}

Assistant:

ON_wStringHeader* ON_wString::Header() const
{
  ON_wStringHeader* hdr = (ON_wStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_wstring.header;
  return hdr;
}